

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNew,int fVerbose)

{
  Vec_Ptr_t *in_RAX;
  Gia_Man_t *p;
  Abc_Ntk_t *pAVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  Abc_Des_t *pAVar5;
  int iVar6;
  int i;
  Vec_Ptr_t *vBuffers;
  Vec_Ptr_t *local_38;
  
  local_38 = in_RAX;
  p = Abc_NtkFlattenHierarchyGia(pNtk,&local_38,fVerbose);
  iVar6 = p->vCis->nSize - p->nRegs;
  if (iVar6 != pNtk->vPis->nSize) {
    __assert_fail("Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x21f,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (iVar6 != pNew->vPis->nSize) {
    __assert_fail("Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x220,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar6 = p->vCos->nSize - p->nRegs;
  if (iVar6 != pNtk->vPos->nSize) {
    __assert_fail("Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x221,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (iVar6 == pNew->vPos->nSize) {
    if (p->nBufs != local_38->nSize) {
      __assert_fail("Gia_ManBufNum(pGia) == Vec_PtrSize(vBuffers)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                    ,0x223,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
    }
    if (p->nBufs == pNew->nBarBufs2) {
      Gia_ManStop(p);
      pAVar5 = pNtk->pDesign;
      if (pAVar5 == (Abc_Des_t *)0x0) {
        Abc_NtkCleanCopy(pNtk);
      }
      else {
        for (iVar6 = 0; iVar6 < pAVar5->vModules->nSize; iVar6 = iVar6 + 1) {
          pAVar1 = (Abc_Ntk_t *)Vec_PtrEntry(pAVar5->vModules,iVar6);
          Abc_NtkCleanCopy(pAVar1);
          pAVar5 = pNtk->pDesign;
        }
      }
      for (iVar6 = 0; iVar6 < pNew->vPis->nSize; iVar6 = iVar6 + 1) {
        pAVar2 = Abc_NtkPi(pNew,iVar6);
        pAVar3 = Abc_NtkPi(pNtk,iVar6);
        (pAVar3->field_6).pCopy = pAVar2;
      }
      for (iVar6 = 0; iVar6 < pNew->vPos->nSize; iVar6 = iVar6 + 1) {
        pAVar2 = Abc_NtkPo(pNew,iVar6);
        pAVar3 = Abc_NtkPo(pNtk,iVar6);
        (pAVar3->field_6).pCopy = pAVar2;
      }
      iVar6 = 0;
      for (i = 0; i < pNew->vObjs->nSize; i = i + 1) {
        pAVar2 = Abc_NtkObj(pNew,i);
        if ((((pAVar2 != (Abc_Obj_t *)0x0) && (pAVar2->pNtk->ntkFunc == ABC_FUNC_MAP)) &&
            ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
           (((pAVar2->vFanins).nSize == 1 && ((pAVar2->field_5).pData == (void *)0x0)))) {
          pvVar4 = Vec_PtrEntry(local_38,iVar6);
          *(Abc_Obj_t **)((long)pvVar4 + 0x40) = pAVar2;
          iVar6 = iVar6 + 1;
        }
      }
      Vec_PtrFree(local_38);
      Abc_NtkCleanCopy(pNew);
      Gia_ManInsertOne(pNtk,pNew);
      pAVar5 = pNtk->pDesign;
      if (pAVar5 != (Abc_Des_t *)0x0) {
        for (iVar6 = 0; iVar6 < pAVar5->vModules->nSize; iVar6 = iVar6 + 1) {
          pAVar1 = (Abc_Ntk_t *)Vec_PtrEntry(pAVar5->vModules,iVar6);
          if (pAVar1 != pNtk) {
            Gia_ManInsertOne(pAVar1,pNew);
          }
          pAVar5 = pNtk->pDesign;
        }
      }
      return;
    }
    __assert_fail("Gia_ManBufNum(pGia) == pNew->nBarBufs2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                  ,0x224,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  __assert_fail("Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                ,0x222,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
}

Assistant:

void Abc_NtkInsertHierarchyGia( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNew, int fVerbose )
{
    Vec_Ptr_t * vBuffers;
    Gia_Man_t * pGia = Abc_NtkFlattenHierarchyGia( pNtk, &vBuffers, 0 );
    Abc_Ntk_t * pModel;  
    Abc_Obj_t * pObj; 
    int i, k = 0;

    assert( Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNtk) );
    assert( Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNew) );
    assert( Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNtk) );
    assert( Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNew) );
    assert( Gia_ManBufNum(pGia) == Vec_PtrSize(vBuffers) );
    assert( Gia_ManBufNum(pGia) == pNew->nBarBufs2 );
    Gia_ManStop( pGia );

    // clean the networks
    if ( !pNtk->pDesign )
        Abc_NtkCleanCopy( pNtk );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            Abc_NtkCleanCopy( pModel );

    // annotate PIs and POs of each network with barbufs
    Abc_NtkForEachPi( pNew, pObj, i )
        Abc_NtkPi(pNtk, i)->pCopy = pObj;
    Abc_NtkForEachPo( pNew, pObj, i )
        Abc_NtkPo(pNtk, i)->pCopy = pObj;
    Abc_NtkForEachBarBuf( pNew, pObj, i )
        ((Abc_Obj_t *)Vec_PtrEntry(vBuffers, k++))->pCopy = pObj;
    Vec_PtrFree( vBuffers );

    // connect each model
    Abc_NtkCleanCopy( pNew );
    Gia_ManInsertOne( pNtk, pNew );
    if ( pNtk->pDesign )
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            if ( pModel != pNtk )
                Gia_ManInsertOne( pModel, pNew );
}